

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_icu::raii_casemap::
convert<int(*)(UCaseMap*,char*,int,char_const*,int,UErrorCode*)>
          (string *__return_storage_ptr__,raii_casemap *this,
          _func_int_UCaseMap_ptr_char_ptr_int_char_ptr_int_UErrorCode_ptr *func,char *begin,
          char *end)

{
  int iVar1;
  int iVar2;
  UErrorCode err;
  vector<char,_std::allocator<char>_> buf;
  
  std::vector<char,_std::allocator<char>_>::vector
            (&buf,(((long)end - (long)begin) * 0xb) / 10 + 1,(allocator_type *)&err);
  err = U_ZERO_ERROR;
  iVar1 = (int)((long)end - (long)begin);
  iVar2 = (*func)(this->map_,
                  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                  (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,begin,iVar1,&err);
  if (err == U_BUFFER_OVERFLOW_ERROR) {
    err = U_ZERO_ERROR;
    std::vector<char,_std::allocator<char>_>::resize(&buf,(long)(iVar2 + 1));
    iVar2 = (*func)(this->map_,
                    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                    (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,begin,iVar1,&err);
  }
  check_and_throw_icu_error(err);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar2);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string convert(Conv func,char const *begin,char const *end) const
        {
                std::vector<char> buf((end-begin)*11/10+1);
                UErrorCode err=U_ZERO_ERROR;
                int size = func(map_,&buf.front(),buf.size(),begin,end-begin,&err);
                if(err == U_BUFFER_OVERFLOW_ERROR) {
                    err = U_ZERO_ERROR;
                    buf.resize(size+1);
                    size = func(map_,&buf.front(),buf.size(),begin,end-begin,&err);
                }
                check_and_throw_icu_error(err);
                return std::string(&buf.front(),size);
        }